

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O0

MPP_RET mpi_enqueue(MppCtx ctx,MppPortType type,MppTask task)

{
  MpiImpl *p;
  MPP_RET ret;
  MppTask task_local;
  MppPortType type_local;
  MppCtx ctx_local;
  
  if ((mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","enter ctx %p type %d task %p\n","mpi_enqueue",ctx,(ulong)type,task);
  }
  p._4_4_ = _check_mpp_ctx((MpiImpl *)ctx,"mpi_enqueue");
  if (p._4_4_ == MPP_OK) {
    if (((int)type < 2) && (task != (MppTask)0x0)) {
      p._4_4_ = Mpp::enqueue(*(Mpp **)((long)ctx + 0x18),type,task);
    }
    else {
      _mpp_log_l(2,"mpi","invalid input type %d task %p\n","mpi_enqueue",(ulong)type,task);
      p._4_4_ = MPP_ERR_UNKNOW;
    }
  }
  if ((mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","leave ctx %p ret %d\n","mpi_enqueue",ctx,(ulong)(uint)p._4_4_);
  }
  return p._4_4_;
}

Assistant:

static MPP_RET mpi_enqueue(MppCtx ctx, MppPortType type, MppTask task)
{
    MPP_RET ret = MPP_NOK;
    MpiImpl *p = (MpiImpl *)ctx;

    mpi_dbg_func("enter ctx %p type %d task %p\n", ctx, type, task);
    do {
        ret = check_mpp_ctx(p);
        if (ret)
            break;;

        if (type >= MPP_PORT_BUTT || NULL == task) {
            mpp_err_f("invalid input type %d task %p\n", type, task);
            ret = MPP_ERR_UNKNOW;
            break;
        }

        ret = p->ctx->enqueue(type, task);
    } while (0);

    mpi_dbg_func("leave ctx %p ret %d\n", ctx, ret);
    return ret;
}